

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  uint uVar1;
  ZSTD_dStage ZVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ZSTD_dStreamStage ZVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  void *src_00;
  void *pvVar14;
  void *dst;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  size_t local_a8;
  void *local_88;
  
  uVar13 = input->pos;
  uVar3 = input->size;
  sVar15 = 0xffffffffffffffb8;
  if (uVar13 <= uVar3) {
    uVar4 = output->size;
    sVar15 = 0xffffffffffffffba;
    if (output->pos <= uVar4) {
      src_00 = (void *)(uVar13 + (long)input->src);
      pvVar18 = (void *)(uVar3 + (long)input->src);
      pvVar5 = output->dst;
      pvVar14 = (void *)(output->pos + (long)pvVar5);
      src = zds->headerBuffer;
      dst = pvVar14;
      local_88 = src_00;
LAB_0015e138:
      bVar8 = true;
      local_a8 = sVar15;
      bVar7 = bVar8;
      switch(zds->streamStage) {
      case zdss_init:
        goto switchD_0015e15b_caseD_0;
      case zdss_loadHeader:
        goto switchD_0015e15b_caseD_1;
      case zdss_read:
        goto switchD_0015e15b_caseD_2;
      case zdss_load:
        goto LAB_0015e655;
      case zdss_flush:
        goto switchD_0015e15b_caseD_4;
      default:
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar15;
switchD_0015e15b_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
  zds->lhSize = 0;
  zds->outStart = 0;
  zds->outEnd = 0;
switchD_0015e15b_caseD_1:
  sVar12 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,zds->lhSize,zds->format);
  if (sVar12 < 0xffffffffffffff89) {
    if (sVar12 == 0) {
      iVar9 = 0;
    }
    else {
      sVar6 = zds->lhSize;
      uVar19 = sVar12 - sVar6;
      uVar16 = (long)pvVar18 - (long)local_88;
      if (uVar16 < uVar19) {
        if (pvVar18 != local_88) {
          memcpy(src + sVar6,local_88,uVar16);
          zds->lhSize = zds->lhSize + uVar16;
        }
        input->pos = input->size;
        if (sVar12 < 7) {
          sVar12 = 6;
        }
        sVar12 = (sVar12 - zds->lhSize) + 3;
        goto LAB_0015e22f;
      }
      memcpy(src + sVar6,local_88,uVar19);
      zds->lhSize = sVar12;
      local_88 = (void *)((long)local_88 + uVar19);
      iVar9 = 4;
    }
  }
  else {
LAB_0015e22f:
    sVar15 = sVar12;
    iVar9 = 1;
  }
  bVar7 = true;
  bVar8 = true;
  local_a8 = sVar15;
  if (iVar9 != 4) {
    if (iVar9 != 0) {
      return sVar15;
    }
    uVar16 = (zds->fParams).frameContentSize;
    if (((uVar16 != 0) && ((zds->fParams).windowSize != 0)) &&
       (uVar19 = (long)pvVar5 + (uVar4 - (long)dst), uVar16 <= uVar19)) {
      sVar12 = ZSTD_findFrameCompressedSize(src_00,uVar3 - uVar13);
      if (uVar3 - uVar13 < sVar12) {
        bVar7 = true;
        iVar9 = 0;
      }
      else {
        local_a8 = ZSTD_decompressMultiFrame(zds,dst,uVar19,src_00,sVar12,(void *)0x0,0,zds->ddict);
        bVar7 = 0xffffffffffffff88 < local_a8;
        if (bVar7) {
          iVar9 = 1;
        }
        else {
          local_88 = (void *)(sVar12 + (long)src_00);
          dst = (void *)((long)dst + local_a8);
          zds->expected = 0;
          zds->streamStage = zdss_init;
          iVar9 = 4;
          local_a8 = sVar15;
        }
      }
      if (iVar9 == 4) goto LAB_0015e882;
      sVar15 = local_a8;
      bVar8 = bVar7;
      if (iVar9 != 0) {
        return local_a8;
      }
    }
    ZSTD_decompressBegin_usingDDict(zds,zds->ddict);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar12 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
      if (0xffffffffffffff88 < sVar12) {
        return sVar12;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    uVar16 = (zds->fParams).windowSize;
    if (uVar16 < 0x401) {
      uVar16 = 0x400;
    }
    (zds->fParams).windowSize = uVar16;
    if (zds->maxWindowSize < uVar16) {
      return 0xfffffffffffffff0;
    }
    uVar1 = (zds->fParams).blockSizeMax;
    if (uVar1 < 5) {
      uVar1 = 4;
    }
    uVar17 = (ulong)uVar1;
    uVar19 = (zds->fParams).frameContentSize;
    uVar20 = 0x20000;
    if (uVar16 < 0x20000) {
      uVar20 = uVar16;
    }
    uVar16 = uVar16 + uVar20 + 0x10;
    if (uVar16 < uVar19) {
      uVar19 = uVar16;
    }
    if ((zds->inBuffSize < uVar17) || (zds->outBuffSize < uVar19)) {
      if (zds->staticSize == 0) {
        ZSTD_free(zds->inBuff,zds->customMem);
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        pcVar11 = (char *)ZSTD_malloc(uVar17 + uVar19,zds->customMem);
        zds->inBuff = pcVar11;
        if (pcVar11 != (char *)0x0) goto LAB_0015e51e;
      }
      else if (uVar17 + uVar19 <= zds->staticSize - 0x271e8) {
LAB_0015e51e:
        zds->inBuffSize = uVar17;
        zds->outBuff = zds->inBuff + uVar17;
        zds->outBuffSize = uVar19;
        goto LAB_0015e542;
      }
      bVar7 = false;
      sVar15 = 0xffffffffffffffc0;
    }
    else {
LAB_0015e542:
      bVar7 = true;
    }
    if (!bVar7) {
      return sVar15;
    }
    zds->streamStage = zdss_read;
switchD_0015e15b_caseD_2:
    uVar16 = zds->expected;
    if (uVar16 == 0) {
      ZVar10 = zdss_init;
      bVar8 = false;
LAB_0015e5ad:
      zds->streamStage = ZVar10;
      iVar9 = 4;
      local_a8 = sVar15;
      bVar7 = bVar8;
    }
    else {
      iVar9 = 0;
      local_a8 = sVar15;
      bVar7 = bVar8;
      if (uVar16 <= (ulong)((long)pvVar18 - (long)local_88)) {
        ZVar2 = zds->stage;
        if (ZVar2 == ZSTDds_skipFrame) {
          sVar12 = 0;
        }
        else {
          sVar12 = zds->outBuffSize - zds->outStart;
        }
        sVar12 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar12,local_88,uVar16);
        iVar9 = 1;
        local_a8 = sVar12;
        if ((sVar12 < 0xffffffffffffff89) &&
           ((local_88 = (void *)((long)local_88 + uVar16), ZVar2 == ZSTDds_skipFrame ||
            (iVar9 = 4, local_a8 = sVar15, sVar12 != 0)))) {
          zds->outEnd = zds->outStart + sVar12;
          ZVar10 = zdss_flush;
          goto LAB_0015e5ad;
        }
      }
    }
    if (iVar9 != 4) {
      if (iVar9 != 0) {
        return local_a8;
      }
      if (local_88 == pvVar18) {
        bVar7 = false;
      }
      else {
        zds->streamStage = zdss_load;
LAB_0015e655:
        sVar15 = zds->expected;
        sVar12 = zds->inPos;
        uVar19 = sVar15 - sVar12;
        ZVar2 = zds->stage;
        uVar16 = uVar19;
        if (ZVar2 == ZSTDds_skipFrame) {
          if ((ulong)((long)pvVar18 - (long)local_88) <= uVar19) {
            uVar16 = (long)pvVar18 - (long)local_88;
          }
LAB_0015e6e5:
          zds->inPos = zds->inPos + uVar16;
          local_88 = (void *)((long)local_88 + uVar16);
          iVar9 = 4;
          if (uVar16 < uVar19) {
            bVar7 = false;
          }
          else {
            sVar15 = ZSTD_decompressContinue
                               (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                zds->inBuff,sVar15);
            if (sVar15 < 0xffffffffffffff89) {
              zds->inPos = 0;
              if ((ZVar2 == ZSTDds_skipFrame) || (sVar15 != 0)) {
                zds->outEnd = zds->outStart + sVar15;
                iVar9 = 0;
              }
              else {
                zds->streamStage = zdss_read;
              }
            }
            else {
              iVar9 = 1;
              local_a8 = sVar15;
            }
          }
        }
        else {
          if (uVar19 <= zds->inBuffSize - sVar12) {
            if ((ulong)((long)pvVar18 - (long)local_88) <= uVar19) {
              uVar16 = (long)pvVar18 - (long)local_88;
            }
            memcpy(zds->inBuff + sVar12,local_88,uVar16);
            goto LAB_0015e6e5;
          }
          local_a8 = 0xffffffffffffffec;
          iVar9 = 1;
        }
        if (iVar9 != 4) {
          if (iVar9 != 0) {
            return local_a8;
          }
          zds->streamStage = zdss_flush;
switchD_0015e15b_caseD_4:
          uVar19 = zds->outEnd - zds->outStart;
          uVar20 = (long)pvVar5 + (uVar4 - (long)dst);
          uVar16 = uVar20;
          if (uVar19 <= uVar20) {
            uVar16 = uVar19;
          }
          memcpy(dst,zds->outBuff + zds->outStart,uVar16);
          dst = (void *)((long)dst + uVar16);
          sVar15 = uVar16 + zds->outStart;
          zds->outStart = sVar15;
          if (uVar20 < uVar19) {
            bVar7 = false;
          }
          else {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < sVar15 + (zds->fParams).blockSizeMax)) {
              zds->outStart = 0;
              zds->outEnd = 0;
            }
          }
        }
      }
    }
  }
LAB_0015e882:
  sVar15 = local_a8;
  if (!bVar7) {
    uVar13 = (long)local_88 + (input->pos - (long)src_00);
    input->pos = uVar13;
    output->pos = (long)dst + (output->pos - (long)pvVar14);
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd == zds->outStart) {
      if (zds->hostageByte != 0) {
        if (input->size <= uVar13) {
          zds->streamStage = zdss_read;
          return 1;
        }
        input->pos = uVar13 + 1;
      }
      return 0;
    }
    if (zds->hostageByte != 0) {
      return 1;
    }
    input->pos = uVar13 - 1;
    zds->hostageByte = 1;
    return 1;
  }
  goto LAB_0015e138;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? zds->ddict->dictContent : NULL;
                        size_t const dictSize = zds->ddict ? zds->ddict->dictSize : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_frameHeaderSize_min, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_frameIdSize);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default: return ERROR(GENERIC);   /* impossible */
    }   }

    /* result */
    input->pos += (size_t)(ip-istart);
    output->pos += (size_t)(op-ostart);
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}